

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleMenu::childAt(QAccessibleMenu *this,int x,int y)

{
  char cVar1;
  QMenu *this_00;
  QWidget *pQVar2;
  QAction *action;
  QAccessibleInterface *pQVar3;
  long in_FS_OFFSET;
  QPoint local_38;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = menu(this);
  pQVar2 = &menu(this)->super_QWidget;
  local_38.xp.m_i = x;
  local_38.yp.m_i = y;
  local_30 = QWidget::mapFromGlobal(pQVar2,&local_38);
  action = QMenu::actionAt(this_00,&local_30);
  if (action != (QAction *)0x0) {
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      pQVar2 = &menu(this)->super_QWidget;
      pQVar3 = getOrCreateMenu(pQVar2,action);
      goto LAB_004cdd30;
    }
  }
  pQVar3 = (QAccessibleInterface *)0x0;
LAB_004cdd30:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenu::childAt(int x, int y) const
{
    QAction *act = menu()->actionAt(menu()->mapFromGlobal(QPoint(x,y)));
    if (act && act->isSeparator())
        act = nullptr;
    return act ? getOrCreateMenu(menu(), act) : nullptr;
}